

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt_env_infrastructure.cpp
# Opt level: O1

void __thiscall
so_5::env_infrastructures::default_mt::impl::coop_repo_t::coop_repo_t
          (coop_repo_t *this,environment_t *env,coop_listener_unique_ptr_t *coop_listener)

{
  _Head_base<0UL,_so_5::coop_listener_t_*,_false> local_10;
  
  local_10._M_head_impl =
       (coop_listener->_M_t).
       super___uniq_ptr_impl<so_5::coop_listener_t,_std::default_delete<so_5::coop_listener_t>_>.
       _M_t.
       super__Tuple_impl<0UL,_so_5::coop_listener_t_*,_std::default_delete<so_5::coop_listener_t>_>.
       super__Head_base<0UL,_so_5::coop_listener_t_*,_false>._M_head_impl;
  (coop_listener->_M_t).
  super___uniq_ptr_impl<so_5::coop_listener_t,_std::default_delete<so_5::coop_listener_t>_>._M_t.
  super__Tuple_impl<0UL,_so_5::coop_listener_t_*,_std::default_delete<so_5::coop_listener_t>_>.
  super__Head_base<0UL,_so_5::coop_listener_t_*,_false>._M_head_impl = (coop_listener_t *)0x0;
  so_5::impl::coop_repository_basis_t::coop_repository_basis_t
            (&this->super_coop_repository_basis_t,env,(coop_listener_unique_ptr_t *)&local_10);
  if (local_10._M_head_impl != (coop_listener_t *)0x0) {
    (*(local_10._M_head_impl)->_vptr_coop_listener_t[1])();
  }
  local_10._M_head_impl = (coop_listener_t *)0x0;
  std::condition_variable::condition_variable(&this->m_deregistration_started_cond);
  std::condition_variable::condition_variable(&this->m_deregistration_finished_cond);
  (this->m_final_dereg_chain).m_obj = (abstract_message_chain_t *)0x0;
  (this->m_final_dereg_thread)._M_id._M_thread = 0;
  return;
}

Assistant:

coop_repo_t::coop_repo_t(
	environment_t & env,
	coop_listener_unique_ptr_t coop_listener )
	:	coop_repository_basis_t( env, std::move(coop_listener) )
	{}